

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O2

string * tinyusdz::quote(string *__return_storage_ptr__,string *s,string *quote_str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  ::std::operator+(&bStack_38,quote_str,s);
  ::std::operator+(__return_storage_ptr__,&bStack_38,quote_str);
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline std::string quote(const std::string &s,
                         const std::string &quote_str = "\"") {
  return quote_str + s + quote_str;
}